

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

void __thiscall HandleTpl::restoreXml(HandleTpl *this,Element *el,AddrSpaceManager *manage)

{
  pointer ppEVar1;
  
  ppEVar1 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ConstTpl::restoreXml(&this->space,*ppEVar1,manage);
  ConstTpl::restoreXml(&this->size,ppEVar1[1],manage);
  ConstTpl::restoreXml(&this->ptrspace,ppEVar1[2],manage);
  ConstTpl::restoreXml(&this->ptroffset,ppEVar1[3],manage);
  ConstTpl::restoreXml(&this->ptrsize,ppEVar1[4],manage);
  ConstTpl::restoreXml(&this->temp_space,ppEVar1[5],manage);
  ConstTpl::restoreXml(&this->temp_offset,ppEVar1[6],manage);
  return;
}

Assistant:

void HandleTpl::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  space.restoreXml(*iter,manage);
  ++iter;
  size.restoreXml(*iter,manage);
  ++iter;
  ptrspace.restoreXml(*iter,manage);
  ++iter;
  ptroffset.restoreXml(*iter,manage);
  ++iter;
  ptrsize.restoreXml(*iter,manage);
  ++iter;
  temp_space.restoreXml(*iter,manage);
  ++iter;
  temp_offset.restoreXml(*iter,manage);
}